

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

TemplateDictionary * __thiscall
ctemplate::TemplateDictionary::AddSectionDictionary
          (TemplateDictionary *this,TemplateString section_name)

{
  small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *c;
  TemplateString key;
  TemplateDictionary *pTVar1;
  TemplateId v;
  second_type this_00;
  char *in_R9;
  TemplateDictionary *retval;
  string newname;
  TemplateString local_40;
  
  LazilyCreateDict<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>>
            (this,&this->section_dict_);
  c = this->section_dict_;
  v = TemplateString::GetGlobalId(&section_name);
  this_00 = find_ptr2<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                      (c,v);
  if (this_00 == (second_type)0x0) {
    this_00 = CreateDictVector(this);
    std::
    vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
    ::reserve(this_00,8);
    key.length_ = section_name.length_;
    key.ptr_ = section_name.ptr_;
    key.is_immutable_ = section_name.is_immutable_;
    key._17_7_ = section_name._17_7_;
    key.id_ = section_name.id_;
    HashInsert<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>
              (this->section_dict_,key,this_00);
  }
  CreateSubdictName_abi_cxx11_
            (&newname,(TemplateDictionary *)&this->name_,&section_name,
             (TemplateString *)
             (((long)(this_00->
                     super__Vector_base<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(this_00->
                     super__Vector_base<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) + 1),0x135aa7,in_R9);
  local_40.ptr_ = newname._M_dataplus._M_p;
  local_40.length_ = newname._M_string_length;
  local_40.is_immutable_ = false;
  local_40.id_ = 0;
  retval = CreateTemplateSubdict(this,&local_40,this->arena_,this,this->template_global_dict_owner_)
  ;
  std::
  vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
  ::push_back(this_00,&retval);
  pTVar1 = retval;
  std::__cxx11::string::~string((string *)&newname);
  return pTVar1;
}

Assistant:

TemplateDictionary* TemplateDictionary::AddSectionDictionary(
    const TemplateString section_name) {
  LazilyCreateDict(&section_dict_);
  DictVector* dicts = find_ptr2(*section_dict_, section_name.GetGlobalId());
  if (!dicts) {
    dicts = CreateDictVector();
    // Since most lists will remain under 8 or 16 entries but will frequently
    // be more than four, this prevents copying from 1->2->4->8.
    dicts->reserve(8);
    HashInsert(section_dict_, section_name, dicts);
  }
  assert(dicts != NULL);
  const string newname(CreateSubdictName(name_, section_name,
                                         dicts->size() + 1, ""));
  TemplateDictionary* retval = CreateTemplateSubdict(
      newname, arena_, this, template_global_dict_owner_);
  dicts->push_back(retval);
  return retval;
}